

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O0

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  double dVar3;
  int i_5;
  float norm_var_inv_1;
  float norm_var_1;
  float sqmean_1;
  float *outptr_3;
  int q_7;
  int i_4;
  float *outptr_2;
  int q_6;
  float norm_var_inv;
  float norm_var;
  int q_5;
  float sqmean;
  int i_3;
  float s_1;
  float *ptr_3;
  int q_4;
  Mat sqsum;
  int i_2;
  float mean_1;
  float *outptr_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *outptr;
  float *ptr_1;
  int q_2;
  int q_1;
  float mean;
  int i;
  float s;
  float *ptr;
  int q;
  Mat sum;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_fffffffffffff2a8;
  Allocator *in_stack_fffffffffffff2b0;
  void **ppvVar4;
  undefined4 in_stack_fffffffffffff2b8;
  int in_stack_fffffffffffff2bc;
  Mat *in_stack_fffffffffffff2c0;
  undefined8 in_stack_fffffffffffff2c8;
  Mat *in_stack_fffffffffffff2d0;
  int local_b68;
  undefined8 local_b58;
  undefined8 local_b50;
  undefined8 local_b48;
  undefined4 local_b40;
  long local_b38;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined8 local_b18;
  long local_b10;
  int local_b08;
  int local_b04;
  undefined8 local_b00;
  undefined8 local_af8;
  undefined8 local_af0;
  undefined4 local_ae8;
  long local_ae0;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined8 local_ac0;
  long local_ab8;
  int local_aac;
  float local_aa8;
  float local_aa4;
  int local_aa0;
  float local_a9c;
  int local_a98;
  float local_a94;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined8 local_a80;
  undefined4 local_a78;
  long local_a70;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined8 local_a50;
  long local_a48;
  int local_a3c;
  void *local_a38;
  int *local_a30;
  undefined8 local_a28;
  undefined4 local_a20;
  long *local_a18;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  int local_a00;
  long local_9f8;
  int local_9f0;
  float local_9ec;
  undefined8 local_9e8;
  undefined8 local_9e0;
  undefined8 local_9d8;
  undefined4 local_9d0;
  long local_9c8;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined8 local_9a8;
  long local_9a0;
  undefined8 local_998;
  undefined8 local_990;
  undefined8 local_988;
  undefined4 local_980;
  long local_978;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined8 local_958;
  long local_950;
  int local_948;
  int local_944;
  undefined8 local_940;
  undefined8 local_938;
  undefined8 local_930;
  undefined4 local_928;
  long local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined8 local_900;
  long local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined4 local_8d8;
  long local_8d0;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined8 local_8b0;
  long local_8a8;
  int local_89c;
  int local_898;
  float local_894;
  int local_890;
  float local_88c;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined4 local_870;
  long local_868;
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined8 local_848;
  long local_840;
  int local_834;
  int local_830;
  void *local_820;
  int *local_818;
  undefined8 local_810;
  undefined4 local_808;
  long *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  int local_7e8;
  long local_7e0;
  int local_7d4;
  long local_7d0;
  int local_7c4;
  int local_7c0;
  int local_7bc;
  long local_7b8;
  long *local_7b0;
  long *local_7a8;
  int local_794;
  void **local_790;
  void **local_788;
  long *local_780;
  undefined8 local_778;
  long local_770;
  int local_764;
  void **local_760;
  undefined8 local_758;
  long local_750;
  int local_744;
  void **local_740;
  undefined1 local_735;
  int local_734;
  undefined8 *local_728;
  undefined1 local_71d;
  int local_71c;
  undefined8 *local_710;
  undefined1 local_705;
  int local_704;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6c0;
  undefined8 *local_6b0;
  undefined8 *local_6a0;
  undefined8 *local_690;
  undefined8 *local_680;
  undefined8 *local_670;
  undefined8 *local_660;
  undefined8 *local_650;
  void **local_640;
  void **local_630;
  long local_620;
  void **local_618;
  long local_610;
  void **local_608;
  long local_600;
  void **local_5f8;
  long local_5f0;
  void **local_5e8;
  long local_5e0;
  void **local_5d8;
  long local_5d0;
  void **local_5c8;
  undefined1 local_5bd;
  int local_5bc;
  undefined8 *local_5b0;
  undefined1 local_59d;
  int local_59c;
  undefined8 *local_590;
  undefined1 local_57d;
  int local_57c;
  undefined8 *local_570;
  undefined1 local_55d;
  int local_55c;
  undefined8 *local_550;
  undefined1 local_53d;
  int local_53c;
  undefined8 *local_530;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  long *local_4f8;
  void **local_4f0;
  void **local_4e8;
  long local_4e0;
  undefined4 local_4d4;
  long local_4d0;
  long local_4c8;
  undefined4 local_4bc;
  int local_4b8;
  int local_4b4;
  undefined8 *local_4b0;
  long local_4a8;
  undefined4 local_49c;
  long local_498;
  long local_490;
  undefined4 local_484;
  int local_480;
  int local_47c;
  undefined8 *local_478;
  long local_470;
  undefined4 local_464;
  long local_460;
  long local_458;
  undefined4 local_44c;
  int local_448;
  int local_444;
  undefined8 *local_440;
  long local_438;
  undefined4 local_42c;
  long local_428;
  long local_420;
  undefined4 local_414;
  int local_410;
  int local_40c;
  undefined8 *local_408;
  long local_400;
  undefined4 local_3f4;
  long local_3f0;
  long local_3e8;
  undefined4 local_3dc;
  int local_3d8;
  int local_3d4;
  undefined8 *local_3d0;
  long local_3c8;
  undefined4 local_3bc;
  long local_3b8;
  long local_3b0;
  undefined4 local_3a4;
  int local_3a0;
  int local_39c;
  undefined8 *local_398;
  long local_390;
  undefined4 local_384;
  long local_380;
  long local_378;
  undefined4 local_36c;
  int local_368;
  int local_364;
  undefined8 *local_360;
  long local_358;
  undefined4 local_34c;
  long local_348;
  long local_340;
  undefined4 local_334;
  int local_330;
  int local_32c;
  undefined8 *local_328;
  undefined4 local_31c;
  long local_318;
  undefined4 local_30c;
  long local_308;
  undefined4 local_2fc;
  long local_2f8;
  undefined4 local_2ec;
  long local_2e8;
  undefined4 local_2dc;
  long local_2d8;
  undefined4 local_2cc;
  long local_2c8;
  undefined4 local_2bc;
  long local_2b8;
  undefined4 local_2ac;
  long local_2a8;
  int local_240;
  undefined4 local_23c;
  void **local_238;
  int local_220;
  undefined4 local_21c;
  void **local_218;
  undefined8 *local_1f8;
  undefined8 *local_1d8;
  undefined8 *local_1b8;
  undefined8 *local_198;
  undefined8 *local_178;
  undefined8 *local_158;
  undefined8 *local_138;
  undefined8 *local_118;
  void *local_48;
  void *local_38;
  
  local_7bc = *(int *)((long)in_RSI + 0x2c);
  local_7c0 = (int)in_RSI[6];
  local_7c4 = (int)in_RSI[7];
  local_7d0 = in_RSI[2];
  local_7d4 = local_7bc * local_7c0;
  local_7b8 = in_RCX;
  local_7b0 = in_RDX;
  local_7a8 = in_RSI;
  Mat::create(in_stack_fffffffffffff2d0,(int)((ulong)in_stack_fffffffffffff2c8 >> 0x20),
              (int)in_stack_fffffffffffff2c8,(int)((ulong)in_stack_fffffffffffff2c0 >> 0x20),
              CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
              in_stack_fffffffffffff2b0);
  local_780 = local_7b0;
  bVar2 = true;
  if (*local_7b0 != 0) {
    local_4f8 = local_7b0;
    bVar2 = local_7b0[8] * (long)(int)local_7b0[7] == 0;
  }
  if (bVar2) {
    return -100;
  }
  local_778 = *(undefined8 *)(local_7b8 + 0x10);
  local_760 = &local_820;
  local_764 = local_7c4;
  local_770 = local_7d0;
  local_820 = (void *)0x0;
  local_818 = (int *)0x0;
  local_810 = 0;
  local_808 = 0;
  local_800 = (long *)0x0;
  local_7f8 = 0;
  local_7f4 = 0;
  local_7f0 = 0;
  local_7ec = 0;
  local_7e8 = 0;
  local_7e0 = 0;
  Mat::create(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,(size_t)in_stack_fffffffffffff2b0,
              in_stack_fffffffffffff2a8);
  local_788 = &local_820;
  if (local_820 != (void *)0x0) {
    local_4f0 = local_788;
  }
  if (local_820 != (void *)0x0 && local_7e0 * local_7e8 != 0) {
    for (local_834 = 0; local_834 < local_7c4; local_834 = local_834 + 1) {
      local_6f8 = &local_888;
      local_39c = *(int *)((long)local_7a8 + 0x2c);
      local_3a0 = (int)local_7a8[6];
      local_3a4 = *(undefined4 *)((long)local_7a8 + 0x34);
      local_840 = *local_7a8 + local_7a8[8] * (long)local_834 * local_7a8[2];
      local_3b8 = local_7a8[2];
      local_3bc = (undefined4)local_7a8[3];
      local_3c8 = local_7a8[4];
      local_398 = &local_888;
      local_2f8 = (long)local_39c * (long)local_3a0 * local_3b8;
      local_2fc = 0x10;
      local_704 = local_834;
      local_705 = 1;
      local_6e0 = &local_888;
      local_6c0 = &local_888;
      local_888 = 0;
      local_878 = 0;
      local_870 = 0;
      local_860 = 0;
      local_85c = 0;
      local_858 = 0;
      local_854 = 0;
      local_850 = 0;
      local_848 = 0;
      local_880 = 0;
      local_88c = 0.0;
      for (local_890 = 0; local_890 < local_7d4; local_890 = local_890 + 1) {
        local_88c = *(float *)(local_840 + (long)local_890 * 4) + local_88c;
      }
      local_5d0 = (long)local_834;
      local_5c8 = &local_820;
      *(float *)((long)local_820 + local_5d0 * 4) = local_88c;
      local_3b0 = local_840;
      local_118 = local_6c0;
      local_868 = local_3c8;
    }
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_948 = 0; local_948 < local_7c4; local_948 = local_948 + 1) {
        local_728 = &local_998;
        local_32c = *(int *)((long)local_7a8 + 0x2c);
        local_330 = (int)local_7a8[6];
        local_334 = *(undefined4 *)((long)local_7a8 + 0x34);
        local_950 = *local_7a8 + local_7a8[8] * (long)local_948 * local_7a8[2];
        local_348 = local_7a8[2];
        local_34c = (undefined4)local_7a8[3];
        local_358 = local_7a8[4];
        local_328 = &local_998;
        local_318 = (long)local_32c * (long)local_330 * local_348;
        local_6f0 = &local_998;
        local_690 = &local_998;
        local_31c = 0x10;
        local_734 = local_948;
        local_735 = 1;
        local_998 = 0;
        local_988 = 0;
        local_980 = 0;
        local_96c = 0;
        local_968 = 0;
        local_964 = 0;
        local_960 = 0;
        local_990 = 0;
        local_550 = &local_9e8;
        local_47c = *(int *)((long)local_7b0 + 0x2c);
        local_480 = (int)local_7b0[6];
        local_484 = *(undefined4 *)((long)local_7b0 + 0x34);
        local_9a0 = *local_7b0 + local_7b0[8] * (long)local_948 * local_7b0[2];
        local_498 = local_7b0[2];
        local_49c = (undefined4)local_7b0[3];
        local_4a8 = local_7b0[4];
        local_478 = &local_9e8;
        local_2b8 = (long)local_47c * (long)local_480 * local_498;
        local_2bc = 0x10;
        local_55c = local_948;
        local_55d = 1;
        local_958 = 0;
        local_970 = 0;
        local_510 = &local_9e8;
        local_680 = &local_9e8;
        local_9e8 = 0;
        local_9d8 = 0;
        local_9d0 = 0;
        local_9c0 = 0;
        local_9bc = 0;
        local_9b8 = 0;
        local_9b4 = 0;
        local_9b0 = 0;
        local_9a8 = 0;
        local_9e0 = 0;
        local_5f0 = (long)local_948;
        local_5e8 = &local_820;
        local_9ec = *(float *)((long)local_820 + local_5f0 * 4) / (float)local_7d4;
        for (local_9f0 = 0; local_9f0 < local_7d4; local_9f0 = local_9f0 + 1) {
          *(float *)(local_9a0 + (long)local_9f0 * 4) =
               *(float *)(local_950 + (long)local_9f0 * 4) - local_9ec;
        }
        local_490 = local_9a0;
        local_340 = local_950;
        local_198 = local_680;
        local_178 = local_690;
        local_9c8 = local_4a8;
        local_978 = local_358;
      }
    }
    else {
      local_894 = 0.0;
      for (local_898 = 0; local_898 < local_7c4; local_898 = local_898 + 1) {
        local_5e0 = (long)local_898;
        local_5d8 = &local_820;
        local_894 = *(float *)((long)local_820 + local_5e0 * 4) + local_894;
      }
      local_894 = local_894 / (float)(local_7c4 * local_7d4);
      for (local_89c = 0; local_89c < local_7c4; local_89c = local_89c + 1) {
        local_710 = &local_8f0;
        local_364 = *(int *)((long)local_7a8 + 0x2c);
        local_368 = (int)local_7a8[6];
        local_36c = *(undefined4 *)((long)local_7a8 + 0x34);
        local_8a8 = *local_7a8 + local_7a8[8] * (long)local_89c * local_7a8[2];
        local_380 = local_7a8[2];
        local_384 = (undefined4)local_7a8[3];
        local_390 = local_7a8[4];
        local_360 = &local_8f0;
        local_308 = (long)local_364 * (long)local_368 * local_380;
        local_6e8 = &local_8f0;
        local_6b0 = &local_8f0;
        local_30c = 0x10;
        local_71c = local_89c;
        local_71d = 1;
        local_8f0 = 0;
        local_8e0 = 0;
        local_8d8 = 0;
        local_8c4 = 0;
        local_8c0 = 0;
        local_8bc = 0;
        local_8b8 = 0;
        local_8e8 = 0;
        local_530 = &local_940;
        local_4b4 = *(int *)((long)local_7b0 + 0x2c);
        local_4b8 = (int)local_7b0[6];
        local_4bc = *(undefined4 *)((long)local_7b0 + 0x34);
        local_8f8 = *local_7b0 + local_7b0[8] * (long)local_89c * local_7b0[2];
        local_4d0 = local_7b0[2];
        local_4d4 = (undefined4)local_7b0[3];
        local_4e0 = local_7b0[4];
        local_4b0 = &local_940;
        local_2a8 = (long)local_4b4 * (long)local_4b8 * local_4d0;
        local_2ac = 0x10;
        local_53c = local_89c;
        local_53d = 1;
        local_8b0 = 0;
        local_8c8 = 0;
        local_508 = &local_940;
        local_6a0 = &local_940;
        local_940 = 0;
        local_930 = 0;
        local_928 = 0;
        local_918 = 0;
        local_914 = 0;
        local_910 = 0;
        local_90c = 0;
        local_908 = 0;
        local_900 = 0;
        local_938 = 0;
        for (local_944 = 0; local_944 < local_7d4; local_944 = local_944 + 1) {
          *(float *)(local_8f8 + (long)local_944 * 4) =
               *(float *)(local_8a8 + (long)local_944 * 4) - local_894;
        }
        local_4c8 = local_8f8;
        local_378 = local_8a8;
        local_158 = local_6a0;
        local_138 = local_6b0;
        local_920 = local_4e0;
        local_8d0 = local_390;
      }
    }
    if (*(int *)(in_RDI + 0xd0) != 0) {
      local_758 = *(undefined8 *)(local_7b8 + 0x10);
      local_740 = &local_a38;
      local_744 = local_7c4;
      local_750 = local_7d0;
      local_a38 = (void *)0x0;
      local_a30 = (int *)0x0;
      local_a28 = 0;
      local_a20 = 0;
      local_a18 = (long *)0x0;
      local_a10 = 0;
      local_a0c = 0;
      local_a08 = 0;
      local_a04 = 0;
      local_a00 = 0;
      local_9f8 = 0;
      Mat::create(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,
                  (size_t)in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
      local_790 = &local_a38;
      if (local_a38 != (void *)0x0) {
        local_4e8 = local_790;
      }
      if (local_a38 != (void *)0x0 && local_9f8 * local_a00 != 0) {
        for (local_a3c = 0; local_a3c < local_7c4; local_a3c = local_a3c + 1) {
          local_570 = &local_a90;
          local_444 = *(int *)((long)local_7b0 + 0x2c);
          local_448 = (int)local_7b0[6];
          local_44c = *(undefined4 *)((long)local_7b0 + 0x34);
          local_a48 = *local_7b0 + local_7b0[8] * (long)local_a3c * local_7b0[2];
          local_460 = local_7b0[2];
          local_464 = (undefined4)local_7b0[3];
          local_470 = local_7b0[4];
          local_440 = &local_a90;
          local_2c8 = (long)local_444 * (long)local_448 * local_460;
          local_2cc = 0x10;
          local_57c = local_a3c;
          local_57d = 1;
          local_500 = &local_a90;
          local_670 = &local_a90;
          local_a90 = 0;
          local_a80 = 0;
          local_a78 = 0;
          local_a68 = 0;
          local_a64 = 0;
          local_a60 = 0;
          local_a5c = 0;
          local_a58 = 0;
          local_a50 = 0;
          local_a88 = 0;
          local_a94 = 0.0;
          for (local_a98 = 0; local_a98 < local_7d4; local_a98 = local_a98 + 1) {
            local_a94 = *(float *)(local_a48 + (long)local_a98 * 4) *
                        *(float *)(local_a48 + (long)local_a98 * 4) + local_a94;
          }
          local_600 = (long)local_a3c;
          local_5f8 = &local_a38;
          *(float *)((long)local_a38 + local_600 * 4) = local_a94;
          local_458 = local_a48;
          local_1b8 = local_670;
          local_a70 = local_470;
        }
        if (*(int *)(in_RDI + 0xd4) == 0) {
          for (local_b08 = 0; local_b08 < local_7c4; local_b08 = local_b08 + 1) {
            local_5b0 = &local_b58;
            local_3d4 = *(int *)((long)local_7b0 + 0x2c);
            local_3d8 = (int)local_7b0[6];
            local_3dc = *(undefined4 *)((long)local_7b0 + 0x34);
            local_b10 = *local_7b0 + local_7b0[8] * (long)local_b08 * local_7b0[2];
            local_3f0 = local_7b0[2];
            local_3f4 = (undefined4)local_7b0[3];
            local_400 = local_7b0[4];
            local_3d0 = &local_b58;
            local_2e8 = (long)local_3d4 * (long)local_3d8 * local_3f0;
            local_520 = &local_b58;
            local_650 = &local_b58;
            local_2ec = 0x10;
            local_5bc = local_b08;
            local_5bd = 1;
            local_b58 = 0;
            local_b48 = 0;
            local_b40 = 0;
            local_b30 = 0;
            local_b2c = 0;
            local_b28 = 0;
            local_b24 = 0;
            local_b20 = 0;
            local_b18 = 0;
            local_b50 = 0;
            local_620 = (long)local_b08;
            local_618 = &local_a38;
            local_3e8 = local_b10;
            local_1f8 = local_650;
            local_b38 = local_400;
            dVar3 = std::sqrt((double)(ulong)(uint)(*(float *)((long)local_a38 + local_620 * 4) /
                                                   (float)local_7d4));
            fVar1 = *(float *)(in_RDI + 0xd8);
            for (local_b68 = 0; local_b68 < local_7d4; local_b68 = local_b68 + 1) {
              *(float *)(local_b10 + (long)local_b68 * 4) =
                   *(float *)(local_b10 + (long)local_b68 * 4) * (1.0 / (SUB84(dVar3,0) + fVar1));
            }
          }
        }
        else {
          local_a9c = 0.0;
          for (local_aa0 = 0; local_aa0 < local_7c4; local_aa0 = local_aa0 + 1) {
            local_610 = (long)local_aa0;
            local_608 = &local_a38;
            local_a9c = *(float *)((long)local_a38 + local_610 * 4) + local_a9c;
          }
          local_a9c = local_a9c / (float)(local_7c4 * local_7d4);
          local_aa4 = SQRT(local_a9c) + *(float *)(in_RDI + 0xd8);
          local_aa8 = 1.0 / local_aa4;
          for (local_aac = 0; local_aac < local_7c4; local_aac = local_aac + 1) {
            local_590 = &local_b00;
            local_40c = *(int *)((long)local_7b0 + 0x2c);
            local_410 = (int)local_7b0[6];
            local_414 = *(undefined4 *)((long)local_7b0 + 0x34);
            local_ab8 = *local_7b0 + local_7b0[8] * (long)local_aac * local_7b0[2];
            local_428 = local_7b0[2];
            local_42c = (undefined4)local_7b0[3];
            local_438 = local_7b0[4];
            local_408 = &local_b00;
            local_2d8 = (long)local_40c * (long)local_410 * local_428;
            local_2dc = 0x10;
            local_59c = local_aac;
            local_59d = 1;
            local_518 = &local_b00;
            local_660 = &local_b00;
            local_b00 = 0;
            local_af0 = 0;
            local_ae8 = 0;
            local_ad8 = 0;
            local_ad4 = 0;
            local_ad0 = 0;
            local_acc = 0;
            local_ac8 = 0;
            local_ac0 = 0;
            local_af8 = 0;
            for (local_b04 = 0; local_b04 < local_7d4; local_b04 = local_b04 + 1) {
              *(float *)(local_ab8 + (long)local_b04 * 4) =
                   *(float *)(local_ab8 + (long)local_b04 * 4) * local_aa8;
            }
            local_420 = local_ab8;
            local_1d8 = local_660;
            local_ae0 = local_438;
          }
        }
        local_830 = 0;
      }
      else {
        local_794 = -100;
        local_830 = 1;
      }
      ppvVar4 = &local_a38;
      local_640 = ppvVar4;
      local_218 = ppvVar4;
      if (local_a30 != (int *)0x0) {
        local_21c = 0xffffffff;
        LOCK();
        local_220 = *local_a30;
        *local_a30 = *local_a30 + -1;
        UNLOCK();
        if (local_220 == 1) {
          if (local_a18 == (long *)0x0) {
            local_48 = local_a38;
            if (local_a38 != (void *)0x0) {
              free(local_a38);
            }
          }
          else {
            (**(code **)(*local_a18 + 0x18))(local_a18,local_a38);
          }
        }
      }
      *ppvVar4 = (void *)0x0;
      ppvVar4[2] = (void *)0x0;
      *(undefined4 *)(ppvVar4 + 3) = 0;
      *(undefined4 *)(ppvVar4 + 5) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
      *(undefined4 *)(ppvVar4 + 6) = 0;
      *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
      *(undefined4 *)(ppvVar4 + 7) = 0;
      ppvVar4[8] = (void *)0x0;
      ppvVar4[1] = (void *)0x0;
      if (local_830 != 0) goto LAB_00f0e80e;
    }
    local_794 = 0;
    local_830 = 1;
  }
  else {
    local_794 = -100;
    local_830 = 1;
  }
LAB_00f0e80e:
  local_630 = &local_820;
  if (local_818 != (int *)0x0) {
    local_23c = 0xffffffff;
    LOCK();
    local_240 = *local_818;
    *local_818 = *local_818 + -1;
    UNLOCK();
    if (local_240 == 1) {
      local_238 = local_630;
      if (local_800 == (long *)0x0) {
        local_38 = local_820;
        if (local_820 != (void *)0x0) {
          free(local_820);
        }
      }
      else {
        (**(code **)(*local_800 + 0x18))(local_800,local_820);
      }
    }
  }
  return local_794;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i = 0; i < size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q = 0; q < channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i = 0; i < size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q = 0; q < channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrtf(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
    }

    return 0;
}